

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O1

void __thiscall vmips::la::output(la *this,ostream *out)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  char *__s;
  
  iVar2 = (*(this->super_Unary).super_Instruction._vptr_Instruction[1])();
  __s = (char *)CONCAT44(extraout_var,iVar2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  operator<<(out,(this->super_Unary).target.
                 super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  peVar1 = (this->data).super___shared_ptr<vmips::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(peVar1->name)._M_dataplus._M_p,(peVar1->name)._M_string_length);
  return;
}

Assistant:

void la::output(std::ostream &out) const {
    out << name() << " " << *this->target << ", " << data->name;
}